

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeBBShaft::MultiplyTandAdd
          (ChConstraintThreeBBShaft *this,ChVectorDynamic<double> *result,double l)

{
  undefined1 auVar1 [16];
  ChVariables *pCVar2;
  long lVar3;
  double *pdVar4;
  Index index;
  ulong uVar5;
  ulong uVar6;
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = l;
  pCVar2 = (this->super_ChConstraintThree).variables_a;
  if (pCVar2->disabled == false) {
    lVar3 = (long)pCVar2->offset;
    if ((lVar3 < 0) ||
       ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
        -6 < lVar3)) goto LAB_007f6e3c;
    pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + lVar3;
    uVar5 = 6;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 6)) {
      uVar5 = uVar6;
    }
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pdVar4[uVar6] =
             l * (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar6] + pdVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (uVar5 < 6) {
      do {
        pdVar4[uVar5] =
             l * (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar5] + pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 != 6);
    }
  }
  pCVar2 = (this->super_ChConstraintThree).variables_b;
  if (pCVar2->disabled == false) {
    lVar3 = (long)pCVar2->offset;
    if ((lVar3 < 0) ||
       ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
        -6 < lVar3)) {
LAB_007f6e3c:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + lVar3;
    uVar5 = 6;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 6)) {
      uVar5 = uVar6;
    }
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pdVar4[uVar6] =
             l * (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar6] + pdVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (uVar5 < 6) {
      do {
        pdVar4[uVar5] =
             l * (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar5] + pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 != 6);
    }
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled == false) {
    lVar3 = (long)pCVar2->offset;
    if ((lVar3 < 0) ||
       ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        lVar3)) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.
                   m_storage.m_data.array[0];
    pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar4[lVar3];
    auVar1 = vfmadd213sd_fma(auVar7._0_16_,auVar8,auVar1);
    pdVar4[lVar3] = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), 6) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), 6) += Cq_b.transpose() * l;
    }

    if (variables_c->IsActive()) {
        result(variables_c->GetOffset()) += Cq_c(0) * l;
    }
}